

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  pointer pcVar1;
  size_type sVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar3;
  int index;
  string_view element_name;
  string_view element_name_00;
  anon_class_24_3_0c655f7d make_error;
  EnumValueDescriptor *enum_value;
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  insert_result;
  EnumDescriptor *local_c0;
  int local_b4;
  EnumDescriptorProto *local_b0;
  DescriptorBuilder *local_a8;
  undefined8 *local_a0;
  _Head_base<0UL,_int_&&,_false> local_98;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_90;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  *local_88;
  undefined1 local_80 [24];
  undefined1 local_68 [32];
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  local_c0 = enm;
  local_b0 = proto;
  local_a8 = this;
  CheckEnumValueUniqueness(this,proto,enm);
  if ((((local_c0->merged_features_->field_0)._impl_.enum_type_ != 2) &&
      (0 < local_c0->value_count_)) && (local_c0->values_->number_ != 0)) {
    pcVar1 = local_c0->all_names_[1]._M_dataplus._M_p;
    sVar2 = local_c0->all_names_[1]._M_string_length;
    pVVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                       (&(local_b0->field_0)._impl_.value_.super_RepeatedPtrFieldBase,0);
    element_name._M_str = pcVar1;
    element_name._M_len = sVar2;
    AddError(local_a8,element_name,&pVVar3->super_Message,NUMBER,
             "The first enum value must be zero for open enums.");
  }
  if (((*(byte *)((long)&local_c0->options_->field_0 + 0x18) & 2) == 0) ||
     ((local_c0->options_->field_0)._impl_.allow_alias_ == false)) {
    local_68._0_8_ = 0;
    local_68._8_8_ = 0;
    local_68._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    if (0 < local_c0->value_count_) {
      local_b0 = (EnumDescriptorProto *)&(local_b0->field_0)._impl_.value_;
      index = 0;
      do {
        local_80._0_8_ = EnumDescriptor::value(local_c0,index);
        local_b4 = ((EnumValueDescriptor *)local_80._0_8_)->number_;
        local_98._M_head_impl = &local_b4;
        local_90._M_head_impl = ((EnumValueDescriptor *)local_80._0_8_)->all_names_ + 1;
        local_a0 = (undefined8 *)local_68;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::EmplaceDecomposable::operator()
                  (&local_48,&local_a0,local_98._M_head_impl,
                   (piecewise_construct_t *)&std::piecewise_construct,(tuple<int_&&> *)&local_98,
                   (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&local_90);
        if ((local_48.second == false) &&
           ((local_c0->options_->field_0)._impl_.allow_alias_ == false)) {
          local_98._M_head_impl = (int *)&local_c0;
          local_90._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
          pcVar1 = local_c0->all_names_[1]._M_dataplus._M_p;
          sVar2 = local_c0->all_names_[1]._M_string_length;
          local_88 = &local_48;
          pVVar3 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                             ((RepeatedPtrFieldBase *)local_b0,index);
          local_80._16_8_ =
               absl::lts_20240722::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          local_80._8_8_ = &local_98;
          make_error_00.invoker_ =
               absl::lts_20240722::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = (void *)local_80._8_8_;
          element_name_00._M_str = pcVar1;
          element_name_00._M_len = sVar2;
          AddError(local_a8,element_name_00,&pVVar3->super_Message,NUMBER,make_error_00);
        }
        index = index + 1;
      } while (index < local_c0->value_count_);
    }
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_68);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const EnumDescriptor* enm,
                                        const EnumDescriptorProto& proto) {
  CheckEnumValueUniqueness(proto, enm);

  if (!enm->is_closed() && enm->value_count() > 0 &&
      enm->value(0)->number() != 0) {
    AddError(enm->full_name(), proto.value(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "The first enum value must be zero for open enums.");
  }

  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    absl::flat_hash_map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      auto insert_result =
          used_values.emplace(enum_value->number(), enum_value->full_name());
      bool inserted = insert_result.second;
      if (!inserted) {
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          auto make_error = [&] {
            // Find the next free number.
            absl::flat_hash_set<int64_t> used;
            for (int j = 0; j < enm->value_count(); ++j) {
              used.insert(enm->value(j)->number());
            }
            int64_t next_value = static_cast<int64_t>(enum_value->number()) + 1;
            while (used.contains(next_value)) ++next_value;

            std::string error = absl::StrCat(
                "\"", enum_value->full_name(),
                "\" uses the same enum value as \"",
                insert_result.first->second,
                "\". If this is intended, set "
                "'option allow_alias = true;' to the enum definition.");
            if (next_value < std::numeric_limits<int32_t>::max()) {
              absl::StrAppend(&error, " The next available enum value is ",
                              next_value, ".");
            }
            return error;
          };
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, make_error);
        }
      }
    }
  }
}